

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

size_t EmitArgs(ParseNode *pnode,BOOL fAssignRegs,ByteCodeGenerator *byteCodeGenerator,
               FuncInfo *funcInfo,ProfileId callSiteId,bool emitProfiledArgouts,
               AuxArray<unsigned_int> *spreadIndices)

{
  ParseNodeBin *pPVar1;
  ArgSlot local_30;
  ArgSlot local_2e;
  byte local_2b;
  ProfileId local_2a;
  ArgSlot spreadIndex;
  ArgSlot argIndex;
  bool emitProfiledArgouts_local;
  ProfileId callSiteId_local;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  ParseNodePtr pPStack_10;
  BOOL fAssignRegs_local;
  ParseNode *pnode_local;
  
  local_2e = 0;
  local_30 = 0;
  local_2b = emitProfiledArgouts;
  local_2a = callSiteId;
  _spreadIndex = funcInfo;
  funcInfo_local = (FuncInfo *)byteCodeGenerator;
  byteCodeGenerator_local._4_4_ = fAssignRegs;
  pPStack_10 = pnode;
  if (pnode != (ParseNode *)0x0) {
    while (pPStack_10->nop == knopList) {
      pPVar1 = ParseNode::AsParseNodeBin(pPStack_10);
      EmitOneArg(pPVar1->pnode1,byteCodeGenerator_local._4_4_,(ByteCodeGenerator *)funcInfo_local,
                 _spreadIndex,local_2a,&local_2e,&local_30,0xffffffff,(bool)(local_2b & 1),
                 spreadIndices);
      pPVar1 = ParseNode::AsParseNodeBin(pPStack_10);
      pPStack_10 = pPVar1->pnode2;
    }
    EmitOneArg(pPStack_10,byteCodeGenerator_local._4_4_,(ByteCodeGenerator *)funcInfo_local,
               _spreadIndex,local_2a,&local_2e,&local_30,0xffffffff,(bool)(local_2b & 1),
               spreadIndices);
  }
  return (ulong)local_2e;
}

Assistant:

size_t EmitArgs(
    ParseNode *pnode,
    BOOL fAssignRegs,
    ByteCodeGenerator *byteCodeGenerator,
    FuncInfo *funcInfo,
    Js::ProfileId callSiteId,
    bool emitProfiledArgouts,
    Js::AuxArray<uint32> *spreadIndices = nullptr
    )
{
    Js::ArgSlot argIndex = 0;
    Js::ArgSlot spreadIndex = 0;

    if (pnode != nullptr)
    {
        while (pnode->nop == knopList)
        {
            EmitOneArg(pnode->AsParseNodeBin()->pnode1, fAssignRegs, byteCodeGenerator, funcInfo, callSiteId, argIndex, spreadIndex, Js::Constants::NoRegister, emitProfiledArgouts, spreadIndices);
            pnode = pnode->AsParseNodeBin()->pnode2;
        }

        EmitOneArg(pnode, fAssignRegs, byteCodeGenerator, funcInfo, callSiteId, argIndex, spreadIndex, Js::Constants::NoRegister, emitProfiledArgouts, spreadIndices);
    }

    return argIndex;
}